

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_insert.c
# Opt level: O0

int mpt_gnode_insert(mpt_node *parent,int pos,mpt_node *node)

{
  int *piVar1;
  mpt_node *node_local;
  int pos_local;
  mpt_node *parent_local;
  
  if (node == (mpt_node *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0xe;
    parent_local._4_4_ = -1;
  }
  else if (parent->children == (mpt_node *)0x0) {
    parent->children = node;
    node->parent = parent;
    parent_local._4_4_ = 0;
  }
  else {
    node_insert(parent->children,pos,node,mpt_gnode_pos);
    parent_local._4_4_ = 0;
  }
  return parent_local._4_4_;
}

Assistant:

extern int mpt_gnode_insert(MPT_STRUCT(node) *parent, int pos, MPT_STRUCT(node) *node)
{
	if (!node) {
		errno = EFAULT;
		return -1;
	}
	if (!parent->children) {
		parent->children = node;
		node->parent = parent;
		return 0;
	}
	node_insert(parent->children, pos, node, (MPT_STRUCT(node) *(*)()) mpt_gnode_pos);
	
	return 0;
}